

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O0

void __thiscall
randomx::VmBase<randomx::LargePageAllocator,_false>::~VmBase
          (VmBase<randomx::LargePageAllocator,_false> *this)

{
  code *pcVar1;
  VmBase<randomx::LargePageAllocator,_false> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}